

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O3

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  pointer *ppcVar1;
  int iVar2;
  int iVar3;
  mapped_type pgVar4;
  void *pvVar5;
  void *__src;
  bool bVar6;
  FILE *__stream;
  _Alloc_hider _Var7;
  key_type kVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  value_type *__val;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ggml_context *pgVar19;
  ggml_tensor *pgVar20;
  mapped_type *ppgVar21;
  long *plVar22;
  undefined8 *puVar23;
  iterator iVar24;
  size_t __n;
  undefined8 uVar25;
  ulong uVar26;
  long *plVar27;
  size_type *psVar28;
  undefined8 *puVar29;
  ulong *puVar30;
  uint uVar31;
  long lVar32;
  vector<char,_std::allocator<char>_> *pvVar33;
  long lVar34;
  gpt2_model *pgVar35;
  bool bVar36;
  uint __val_00;
  ulong uVar37;
  gpt2_hparams *hparams;
  pointer pgVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint32_t magic;
  int32_t ne [2];
  int32_t n_vocab;
  int32_t length;
  uint32_t len;
  size_t total_size;
  gpt2_hparams *hparams_1;
  ifstream fin;
  undefined8 uVar42;
  key_type local_348;
  vector<char,_std::allocator<char>_> local_328;
  long lStack_310;
  undefined8 local_300;
  long local_2f0 [2];
  gpt_vocab *local_2e0;
  int local_2d4;
  key_type local_2d0;
  uint local_2cc;
  string *local_2c8;
  _Base_ptr local_2c0;
  long local_2b8;
  size_type local_2b0;
  gpt2_model *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2e0 = vocab;
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p);
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_238,(long)&local_348);
    if ((int)local_348._M_dataplus._M_p != 0x67676d6c) {
      bVar36 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",
              (fname->_M_dataplus)._M_p);
      goto LAB_00109751;
    }
    std::istream::read((char *)local_238,(long)model);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_ctx);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_embd);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_head);
    std::istream::read((char *)local_238,(long)&(model->hparams).n_layer);
    local_2c0 = (_Base_ptr)&(model->hparams).ftype;
    std::istream::read((char *)local_238,(long)local_2c0);
    iVar11 = (model->hparams).ftype;
    printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_vocab);
    printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_ctx);
    printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_embd);
    printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_head);
    printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_layer);
    printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).ftype);
    printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)(uint)(iVar11 / 1000));
    (model->hparams).ftype = (model->hparams).ftype % 1000;
    local_300 = (long *)((ulong)local_300._4_4_ << 0x20);
    std::istream::read((char *)local_238,(long)&local_300);
    if ((int)local_300 != (model->hparams).n_vocab) {
      bVar36 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load",
              (fname->_M_dataplus)._M_p);
      goto LAB_00109751;
    }
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity =
         local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x80);
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start + 0x80);
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x70) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x78) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x60) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x68) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x50) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x58) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x40) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x48) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x30) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x38) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x10) = 0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x18) = 0;
    *(pointer *)
     local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 8) = 0;
    local_2d0 = 0;
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_2a8 = model;
    if ((int)local_300 < 1) {
LAB_0010788e:
      pgVar35 = local_2a8;
      operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    else {
      this = &local_2e0->id_to_token;
      local_2c8 = fname;
      do {
        std::istream::read((char *)local_238,(long)&local_2cc);
        std::vector<char,_std::allocator<char>_>::resize(&local_328,(ulong)local_2cc);
        std::istream::read((char *)local_238,
                           (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_348,0,(char *)local_348._M_string_length,
                   (ulong)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        kVar8 = local_2d0;
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&local_2e0->token_to_id,&local_348);
        *pmVar13 = kVar8;
        pmVar14 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this,&local_2d0);
        std::__cxx11::string::_M_assign((string *)pmVar14);
        local_2d0 = local_2d0 + 1;
      } while (local_2d0 < (int)local_300);
      fname = local_2c8;
      pgVar35 = local_2a8;
      if ((pointer *)
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) goto LAB_0010788e;
    }
    p_Var9 = local_2c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    iVar11 = ggml_ftype_to_ggml_type(p_Var9->_M_color);
    if (iVar11 == 0x27) {
      bVar36 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
              (fname->_M_dataplus)._M_p,(ulong)p_Var9->_M_color);
      goto LAB_00109751;
    }
    iVar2 = (pgVar35->hparams).n_embd;
    lVar34 = (long)iVar2;
    local_2c0 = (_Base_ptr)(long)(pgVar35->hparams).n_layer;
    local_2e0 = (gpt_vocab *)(long)(pgVar35->hparams).n_ctx;
    iVar3 = (pgVar35->hparams).n_vocab;
    local_2d4 = iVar11;
    local_2c8 = (string *)ggml_row_size(0,lVar34);
    local_2b0 = ggml_row_size(0,lVar34);
    lVar32 = iVar3 * lVar34;
    lVar15 = ggml_row_size(local_2d4,lVar32);
    local_2b8 = ggml_row_size(0,(long)local_2e0 * lVar34);
    local_258 = ggml_row_size(local_2d4,lVar32);
    local_260 = ggml_row_size(0,lVar34);
    local_268 = ggml_row_size(0,lVar34);
    lVar32 = ggml_row_size(0,lVar34);
    local_270 = ggml_row_size(0,lVar34);
    local_278 = ggml_row_size(local_2d4,(long)((int)(lVar34 * 3) * iVar2));
    local_280 = ggml_row_size(0,lVar34 * 3);
    local_288 = ggml_row_size(local_2d4,iVar2 * iVar2);
    local_290 = ggml_row_size(0,lVar34);
    iVar11 = iVar2 * 4;
    lVar16 = ggml_row_size(local_2d4,(long)(iVar11 * iVar2));
    local_298 = ggml_row_size(0,(long)iVar11);
    lVar17 = ggml_row_size(local_2d4,(long)(iVar11 * iVar2));
    local_2a0 = ggml_row_size(0,(long)iVar11);
    lVar18 = ggml_row_size(0,lVar34);
    lVar34 = ggml_row_size(0,lVar34);
    lVar15 = (long)&(local_2c8->_M_dataplus)._M_p +
             (lVar17 + local_2a0 +
             lVar16 + local_298 +
             lVar32 + local_270 + local_268 + local_260 + local_280 + local_288 + local_290 +
             local_278) * (long)local_2c0 +
             (lVar34 + lVar18) * (long)local_2e0 * (long)local_2c0 +
             local_258 + lVar15 + local_2b8 + (long)((int)local_2c0 * 0x1800 + 0xc00) + local_2b0;
    printf("%s: ggml tensor size = %d bytes\n","gpt2_model_load",0x150);
    auVar39._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar39._0_8_ = lVar15;
    auVar39._12_4_ = 0x45300000;
    printf("%s: ggml ctx size = %6.2f MB\n",
           ((auVar39._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * 9.5367431640625e-07,
           "gpt2_model_load");
    uStack_248 = 0;
    local_240 = 0;
    uVar42 = 0;
    local_250 = lVar15;
    pgVar19 = (ggml_context *)ggml_init();
    pgVar35 = local_2a8;
    local_2a8->ctx_w = pgVar19;
    if (pgVar19 == (ggml_context *)0x0) {
      gpt2_model_load();
    }
    else {
      lVar16 = (long)(local_2a8->hparams).n_embd;
      local_2b0 = (size_type)(local_2a8->hparams).n_layer;
      iVar11 = (local_2a8->hparams).n_ctx;
      lVar32 = (long)(local_2a8->hparams).n_vocab;
      std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize(&local_2a8->layers,local_2b0);
      pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar16);
      pgVar35->ln_f_g = pgVar20;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar16);
      pgVar35->ln_f_b = pgVar20;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,local_2d4,lVar16,lVar32);
      pgVar35->wte = pgVar20;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,0,lVar16,(long)iVar11);
      pgVar35->wpe = pgVar20;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,local_2d4,lVar16,lVar32);
      pgVar35->lm_head = pgVar20;
      pgVar4 = pgVar35->ln_f_g;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/g","");
      local_2e0 = (gpt_vocab *)&pgVar35->tensors;
      ppgVar21 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e0,&local_348);
      *ppgVar21 = pgVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      pgVar4 = pgVar35->ln_f_b;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/b","");
      ppgVar21 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e0,&local_348);
      *ppgVar21 = pgVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      pgVar4 = pgVar35->wte;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wte","");
      ppgVar21 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e0,&local_348);
      *ppgVar21 = pgVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      pgVar4 = pgVar35->wpe;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wpe","");
      ppgVar21 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e0,&local_348);
      *ppgVar21 = pgVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      pgVar4 = pgVar35->lm_head;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/lm_head","");
      ppgVar21 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_2e0,&local_348);
      *ppgVar21 = pgVar4;
      local_2b8 = lVar16;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if (0 < (int)local_2b0) {
        local_2c8 = (string *)(local_2b8 * 3);
        local_2c0 = (_Base_ptr)(long)((int)local_2b8 * 4);
        uVar37 = 0;
        iVar11 = local_2d4;
        do {
          lVar32 = local_2b8;
          pgVar38 = (pgVar35->layers).super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar37;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,local_2b8);
          pgVar38->ln_1_g = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
          pgVar38->ln_1_b = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
          pgVar38->ln_2_g = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
          pgVar38->ln_2_b = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,iVar11,lVar32,local_2c8);
          pgVar38->c_attn_attn_w = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,local_2c8);
          pgVar38->c_attn_attn_b = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,iVar11,lVar32,lVar32);
          pgVar38->c_attn_proj_w = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
          pgVar38->c_attn_proj_b = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,iVar11,lVar32,local_2c0);
          pgVar38->c_mlp_fc_w = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,local_2c0);
          pgVar38->c_mlp_fc_b = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_2d(pgVar35->ctx_w,iVar11,local_2c0,lVar32);
          pgVar38->c_mlp_proj_w = pgVar20;
          pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
          pgVar38->c_mlp_proj_b = pgVar20;
          uVar31 = 1;
          ppcVar1 = &local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          __val_00 = (uint)uVar37;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00107fd8;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00107fd8;
              }
              if (uVar12 < 10000) goto LAB_00107fd8;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00107fd8:
          pgVar4 = pgVar38->ln_1_g;
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->ln_1_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00108173;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00108173;
              }
              if (uVar12 < 10000) goto LAB_00108173;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00108173:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->ln_2_g;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0010830b;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0010830b;
              }
              if (uVar12 < 10000) goto LAB_0010830b;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_0010830b:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->ln_2_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_001084a3;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_001084a3;
              }
              if (uVar12 < 10000) goto LAB_001084a3;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_001084a3:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_attn_attn_w;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0010863b;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0010863b;
              }
              if (uVar12 < 10000) goto LAB_0010863b;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_0010863b:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_attn_attn_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_001087d3;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_001087d3;
              }
              if (uVar12 < 10000) goto LAB_001087d3;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_001087d3:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_attn_proj_w;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0010896b;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0010896b;
              }
              if (uVar12 < 10000) goto LAB_0010896b;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_0010896b:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_attn_proj_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00108b03;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00108b03;
              }
              if (uVar12 < 10000) goto LAB_00108b03;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00108b03:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_mlp_fc_w;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00108c9b;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00108c9b;
              }
              if (uVar12 < 10000) goto LAB_00108c9b;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00108c9b:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_mlp_fc_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00108e33;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00108e33;
              }
              if (uVar12 < 10000) goto LAB_00108e33;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00108e33:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_mlp_proj_w;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00108fcb;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00108fcb;
              }
              if (uVar12 < 10000) goto LAB_00108fcb;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_00108fcb:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          plVar27 = plVar22 + 2;
          if ((pointer *)*plVar22 == (pointer *)plVar27) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            lStack_310 = plVar22[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar27;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar22;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar28 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar28) {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar28;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)psVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          pgVar35 = local_2a8;
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          pgVar4 = pgVar38->c_mlp_proj_b;
          uVar31 = 1;
          if (9 < uVar37) {
            uVar10 = 4;
            uVar26 = uVar37;
            do {
              uVar31 = uVar10;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0010916b;
              }
              if (uVar12 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0010916b;
              }
              if (uVar12 < 10000) goto LAB_0010916b;
              uVar26 = (uVar26 & 0xffffffff) / 10000;
              uVar10 = uVar31 + 4;
            } while (99999 < uVar12);
            uVar31 = uVar31 + 1;
          }
LAB_0010916b:
          local_300 = local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,(char)uVar31);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,uVar31,__val_00);
          puVar23 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1202dd);
          iVar11 = local_2d4;
          puVar29 = puVar23 + 2;
          if ((pointer *)*puVar23 == (pointer *)puVar29) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*puVar29;
            lStack_310 = puVar23[3];
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppcVar1;
          }
          else {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*puVar29;
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*puVar23;
          }
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)puVar23[1];
          *puVar23 = puVar29;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_328);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          puVar30 = (ulong *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar30) {
            local_348.field_2._M_allocated_capacity = *puVar30;
            local_348.field_2._8_8_ = plVar22[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *puVar30;
            local_348._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_348._M_string_length = plVar22[1];
          *plVar22 = (long)puVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          *ppgVar21 = pgVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != ppcVar1) {
            operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != local_2b0);
      }
      uVar37 = (long)(pgVar35->hparams).n_ctx * (long)(pgVar35->hparams).n_layer;
      lVar32 = (long)(pgVar35->hparams).n_embd * uVar37;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
      pgVar35->memory_k = pgVar20;
      pgVar20 = (ggml_tensor *)ggml_new_tensor_1d(pgVar35->ctx_w,0,lVar32);
      pgVar35->memory_v = pgVar20;
      lVar32 = ggml_nbytes(pgVar35->memory_k);
      lVar16 = ggml_nbytes(pgVar35->memory_v);
      lVar16 = lVar16 + lVar32;
      auVar40._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar40._0_8_ = lVar16;
      auVar40._12_4_ = 0x45300000;
      printf("%s: memory size = %8.2f MB, n_mem = %d\n",
             ((auVar40._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.0009765625 *
             0.0009765625,"gpt2_model_load",uVar37 & 0xffffffff);
      local_2c0 = &(pgVar35->tensors)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_2c8 = (string *)0x0;
      bVar36 = false;
      do {
        std::istream::read((char *)local_238,(long)&local_300);
        std::istream::read((char *)local_238,(long)&local_2d0);
        std::istream::read((char *)local_238,(long)&local_2cc);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
          auVar41._0_8_ = (double)CONCAT44(0x43300000,(int)local_2c8);
          auVar41._8_4_ = (int)((ulong)local_2c8 >> 0x20);
          auVar41._12_4_ = 0x45300000;
          bVar36 = true;
          printf("%s: model size  = %8.2f MB\n",
                 ((auVar41._8_8_ - 1.9342813113834067e+25) + (auVar41._0_8_ - 4503599627370496.0)) *
                 0.0009765625 * 0.0009765625,"gpt2_model_load");
          std::ifstream::close();
          goto LAB_00109751;
        }
        local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x100000001;
        if ((int)local_300 < 1) {
          lVar32 = 1;
        }
        else {
          lVar32 = 1;
          pvVar33 = &local_328;
          lVar16 = 0;
          do {
            std::istream::read((char *)local_238,(long)pvVar33);
            lVar32 = (long)(int)lVar32 *
                     (long)*(int *)&(pvVar33->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 1;
            pvVar33 = (vector<char,_std::allocator<char>_> *)
                      ((long)&(pvVar33->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + 4);
          } while (lVar16 < (int)local_300);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_348,(char)local_2d0);
        std::istream::read((char *)local_238,(long)local_348._M_dataplus._M_p);
        iVar24 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         *)local_2e0,&local_348);
        if (iVar24._M_node == local_2c0) {
          gpt2_model_load();
LAB_001095f9:
          bVar6 = false;
        }
        else {
          ppgVar21 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_2e0,&local_348);
          pgVar4 = *ppgVar21;
          lVar16 = ggml_nelements(pgVar4);
          if (lVar16 != lVar32) {
            gpt2_model_load();
            goto LAB_001095f9;
          }
          if ((pgVar4->ne[0] ==
               (long)(int)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start) &&
             (pgVar4->ne[1] ==
              (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_)) {
            lVar32 = ggml_type_size(local_2cc);
            uVar37 = ggml_blck_size(pgVar4->type);
            uVar26 = ggml_nbytes(pgVar4);
            _Var7._M_p = local_348._M_dataplus._M_p;
            __stream = _stderr;
            if ((ulong)(lVar32 * lVar16) / uVar37 == uVar26) {
              pvVar5 = pgVar4->data;
              ggml_nbytes(pgVar4);
              std::istream::read((char *)local_238,(long)pvVar5);
              iVar11 = std::__cxx11::string::compare((char *)&local_348);
              if ((iVar11 == 0) && (!bVar36)) {
                pvVar5 = local_2a8->lm_head->data;
                __src = pgVar4->data;
                __n = ggml_nbytes(pgVar4);
                memcpy(pvVar5,__src,__n);
              }
              iVar11 = std::__cxx11::string::compare((char *)&local_348);
              lVar32 = ggml_nbytes(pgVar4);
              if (iVar11 == 0) {
                bVar36 = true;
              }
              local_2c8 = (string *)((long)&(local_2c8->_M_dataplus)._M_p + lVar32);
              bVar6 = true;
            }
            else {
              uVar25 = ggml_nbytes(pgVar4);
              bVar6 = false;
              fprintf(__stream,
                      "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                      "gpt2_model_load",_Var7._M_p,uVar25,lVar32 * lVar16);
            }
          }
          else {
            uVar42 = CONCAT44((int)((ulong)uVar42 >> 0x20),
                              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_);
            lVar15 = CONCAT44((int)((ulong)lVar15 >> 0x20),
                              (int)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
            bVar6 = false;
            fprintf(_stderr,
                    "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                    ,"gpt2_model_load",local_348._M_dataplus._M_p,pgVar4->ne[0],pgVar4->ne[1],lVar15
                    ,uVar42);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
      } while (bVar6);
    }
  }
  else {
    gpt2_model_load();
  }
  bVar36 = false;
LAB_00109751:
  std::ifstream::~ifstream(local_238);
  return bVar36;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        ctx_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        ctx_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        ctx_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_k
        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_v

        ctx_size += (6 + 12*n_layer)*512; // object overhead

        printf("%s: ggml tensor size = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                memcpy(model.lm_head->data, tensor->data, ggml_nbytes(tensor));
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}